

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O1

c_non_explicit * __thiscall
boost::ext::di::v1_3_0::providers::stack_over_heap::
get<c_non_explicit,boost::ext::di::v1_3_0::core::successful::any_type_1st_ref<c_non_explicit,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>>>
          (stack_over_heap *this,direct *param_1,heap *param_2,
          any_type_1st_ref<c_non_explicit,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>
          *args)

{
  c_non_explicit *pcVar1;
  scope_impl<empty,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>> local_19;
  provider<boost::ext::di::v1_3_0::aux::pair<empty,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,_boost::ext::di::v1_3_0::aux::type_list<>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>
  local_18;
  
  pcVar1 = (c_non_explicit *)operator_new(1);
  local_18.injector_ = args->injector_;
  scopes::singleton::scope_impl<empty,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
  create_impl<empty,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<empty,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>>>
            (&local_19,&local_18);
  pcVar1->called = true;
  return pcVar1;
}

Assistant:

auto get(const type_traits::direct&, const type_traits::heap&, TArgs&&... args) const {
    return new T(static_cast<TArgs&&>(args)...);
  }